

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

void immutable::rrb_details::ensure_leaf_editable<int,false,6>
               (ref<immutable::rrb_details::leaf_node<int,_false>_> *leaf,guid_type guid)

{
  leaf_node<int,_false> *plVar1;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_18;
  
  plVar1 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(leaf);
  if (plVar1->guid != guid) {
    local_18.ptr = transient_leaf_node_clone<int,false,6>(leaf->ptr,guid);
    if (local_18.ptr != (leaf_node<int,_false> *)0x0) {
      (local_18.ptr)->_ref_count = 1;
    }
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(leaf,&local_18);
    release<int>(local_18.ptr);
  }
  return;
}

Assistant:

inline void ensure_leaf_editable(ref<leaf_node<T, atomic_ref_counting>>& leaf, guid_type guid)
      {
      if (leaf->guid != guid)
        {
        leaf = transient_leaf_node_clone<T, atomic_ref_counting, N>(leaf.ptr, guid);
        }
      }